

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceiverPdu.cpp
# Opt level: O0

bool __thiscall DIS::ReceiverPdu::operator==(ReceiverPdu *this,ReceiverPdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  ReceiverPdu *rhs_local;
  ReceiverPdu *this_local;
  
  local_19 = RadioCommunicationsFamilyPdu::operator==
                       (&this->super_RadioCommunicationsFamilyPdu,
                        &rhs->super_RadioCommunicationsFamilyPdu);
  if (*(short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x3a !=
      *(short *)&(rhs->super_RadioCommunicationsFamilyPdu).field_0x3a) {
    local_19 = false;
  }
  if (*(short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x3c !=
      *(short *)&(rhs->super_RadioCommunicationsFamilyPdu).field_0x3c) {
    local_19 = false;
  }
  if ((this->_receivedPower != rhs->_receivedPower) ||
     (NAN(this->_receivedPower) || NAN(rhs->_receivedPower))) {
    local_19 = false;
  }
  bVar1 = EntityID::operator==(&this->_transmitterEntityId,&rhs->_transmitterEntityId);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_transmitterRadioId != rhs->_transmitterRadioId) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool ReceiverPdu::operator ==(const ReceiverPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = RadioCommunicationsFamilyPdu::operator==(rhs);

     if( ! (_receiverState == rhs._receiverState) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_receivedPower == rhs._receivedPower) ) ivarsEqual = false;
     if( ! (_transmitterEntityId == rhs._transmitterEntityId) ) ivarsEqual = false;
     if( ! (_transmitterRadioId == rhs._transmitterRadioId) ) ivarsEqual = false;

    return ivarsEqual;
 }